

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

size_t ptls_get_read_epoch(ptls_t *tls)

{
  ptls_t *tls_local;
  
  switch(tls->state) {
  case PTLS_STATE_CLIENT_HANDSHAKE_START:
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
  case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
    tls_local = (ptls_t *)0x0;
    break;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    tls_local = (ptls_t *)0x2;
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if (((byte)tls->ctx->field_0x70 >> 4 & 1) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0x147f,"size_t ptls_get_read_epoch(ptls_t *)");
    }
    tls_local = (ptls_t *)0x1;
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    tls_local = (ptls_t *)0x3;
    break;
  default:
    __assert_fail("!\"invalid state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0x148e,"size_t ptls_get_read_epoch(ptls_t *)");
  }
  return (size_t)tls_local;
}

Assistant:

size_t ptls_get_read_epoch(ptls_t *tls)
{
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START:
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        return 0; /* plaintext */
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        return 1; /* 0-rtt */
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        return 2; /* handshake */
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        return 3; /* 1-rtt */
    default:
        assert(!"invalid state");
        return SIZE_MAX;
    }
}